

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

el_action_t ed_next_char(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wchar_t *pwVar2;
  el_action_t eVar3;
  wchar_t *pwVar4;
  
  pwVar1 = (el->el_line).cursor;
  pwVar2 = (el->el_line).lastchar;
  eVar3 = '\x06';
  if ((pwVar1 < pwVar2) &&
     (((pwVar1 != pwVar2 + -1 || ((el->el_map).type != L'\x01')) ||
      ((el->el_chared).c_vcmd.action != L'\0')))) {
    pwVar4 = pwVar1 + (el->el_state).argument;
    if (pwVar2 < pwVar1 + (el->el_state).argument) {
      pwVar4 = pwVar2;
    }
    (el->el_line).cursor = pwVar4;
    eVar3 = '\x05';
    if (((el->el_map).type == L'\x01') && ((el->el_chared).c_vcmd.action != L'\0')) {
      cv_delfini(el);
      eVar3 = '\x04';
    }
  }
  return eVar3;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_next_char(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *lim = el->el_line.lastchar;

	if (el->el_line.cursor >= lim ||
	    (el->el_line.cursor == lim - 1 &&
	    el->el_map.type == MAP_VI &&
	    el->el_chared.c_vcmd.action == NOP))
		return CC_ERROR;

	el->el_line.cursor += el->el_state.argument;
	if (el->el_line.cursor > lim)
		el->el_line.cursor = lim;

	if (el->el_map.type == MAP_VI)
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
	return CC_CURSOR;
}